

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

float __thiscall embree::ParseStream::getFloat(ParseStream *this)

{
  char *__nptr;
  double dVar1;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000068;
  string local_28 [40];
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (in_stack_00000068);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  std::__cxx11::string::~string(local_28);
  return (float)dVar1;
}

Assistant:

float getFloat() {
      return (float)atof(get().c_str());
    }